

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

Timer * __thiscall Allocator::construct<CompilerStatistics::Timer>(Allocator *this,int count)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar4;
  Timer *pTVar3;
  
  iVar2 = (*this->_vptr_Allocator[2])(this,(ulong)(count * 0x28 | 4));
  pTVar3 = (Timer *)CONCAT44(extraout_var,iVar2);
  if (count != 0) {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)&pTVar3->total + lVar4) = 0;
      puVar1 = (undefined8 *)((long)&(pTVar3->outputName).begin + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&(pTVar3->keyName).begin + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar4 = lVar4 + 0x28;
    } while ((long)count * 0x28 - lVar4 != 0);
  }
  return pTVar3;
}

Assistant:

T* construct(int count)
	{
		void *tmp = (void*)alloc(4 + count * sizeof(T));
		new(tmp) T[count];
		return (T*)tmp;
	}